

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall mkvparser::Chapters::Display::Clear(Display *this)

{
  if (this->m_string != (char *)0x0) {
    operator_delete__(this->m_string);
  }
  this->m_string = (char *)0x0;
  if (this->m_language != (char *)0x0) {
    operator_delete__(this->m_language);
  }
  this->m_language = (char *)0x0;
  if (this->m_country != (char *)0x0) {
    operator_delete__(this->m_country);
  }
  this->m_country = (char *)0x0;
  return;
}

Assistant:

void Chapters::Display::Clear() {
  delete[] m_string;
  m_string = NULL;

  delete[] m_language;
  m_language = NULL;

  delete[] m_country;
  m_country = NULL;
}